

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

void __thiscall cs::domain_manager::clear_domain(domain_manager *this)

{
  domain_type *this_00;
  stack_pointer this_01;
  
  this_01 = &this->m_data;
  if (*this->fiber_stack != (stack_pointer)0x0) {
    this_01 = *this->fiber_stack;
  }
  this_00 = stack_type<cs::domain_type,_std::allocator>::top(this_01);
  domain_type::clear(this_00);
  return;
}

Assistant:

void clear_domain()
		{
			if (fiber_stack != nullptr)
				fiber_stack->top().clear();
			else
				m_data.top().clear();
		}